

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11EglPlatform.cpp
# Opt level: O0

NativeWindow * __thiscall
tcu::x11::egl::WindowFactory::createWindow
          (WindowFactory *this,NativeDisplay *nativeDisplay,EGLDisplay eglDisplay,EGLConfig config,
          EGLAttrib *attribList,WindowParams *params)

{
  long *plVar1;
  XlibDisplay *this_00;
  Window *this_01;
  Display *local_70;
  Visual *local_50;
  Visual *visual;
  Display *pDStack_40;
  EGLint visualID;
  Display *display;
  WindowParams *params_local;
  EGLAttrib *attribList_local;
  EGLConfig config_local;
  EGLDisplay eglDisplay_local;
  NativeDisplay *nativeDisplay_local;
  WindowFactory *this_local;
  
  display = (Display *)params;
  params_local = (WindowParams *)attribList;
  attribList_local = (EGLAttrib *)config;
  config_local = eglDisplay;
  eglDisplay_local = nativeDisplay;
  nativeDisplay_local = (NativeDisplay *)this;
  if (nativeDisplay == (NativeDisplay *)0x0) {
    local_70 = (Display *)0x0;
  }
  else {
    local_70 = (Display *)
               __dynamic_cast(nativeDisplay,&eglu::NativeDisplay::typeinfo,&Display::typeinfo,0);
  }
  pDStack_40 = local_70;
  visual._4_4_ = 0;
  local_50 = (Visual *)0x0;
  plVar1 = (long *)(**(code **)(*eglDisplay_local + 0x10))();
  (**(code **)(*plVar1 + 200))(plVar1,config_local,attribList_local,0x302e,(long)&visual + 4);
  if (visual._4_4_ != 0) {
    this_00 = Display::getX11Display(pDStack_40);
    local_50 = XlibDisplay::getVisual(this_00,(long)visual._4_4_);
  }
  this_01 = (Window *)operator_new(0x38);
  Window::Window(this_01,pDStack_40,(WindowParams *)display,local_50);
  return &this_01->super_NativeWindow;
}

Assistant:

NativeWindow* WindowFactory::createWindow (NativeDisplay*			nativeDisplay,
										   eglw::EGLDisplay			eglDisplay,
										   eglw::EGLConfig			config,
										   const eglw::EGLAttrib*	attribList,
										   const WindowParams&		params) const
{
	DE_UNREF(attribList);

	Display&		display		= *dynamic_cast<Display*>(nativeDisplay);
	eglw::EGLint	visualID	= 0;
	::Visual*		visual		= DE_NULL;
	nativeDisplay->getLibrary().getConfigAttrib(eglDisplay, config, EGL_NATIVE_VISUAL_ID, &visualID);

	if (visualID != 0)
		visual = display.getX11Display().getVisual(visualID);

	return new Window(display, params, visual);
}